

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O2

void Bac_ManMarkNodesGia(Bac_Man_t *p,Gia_Man_t *pGia)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int v;
  
  if ((p->vBuf2LeafNtk).nSize != pGia->nBufs) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x118,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
  }
  pGia->pObjs->Value = 1;
  iVar5 = 0;
  while ((iVar5 < pGia->vCis->nSize - pGia->nRegs &&
         (pGVar4 = Gia_ManCi(pGia,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
    pGVar4->Value = 1;
    iVar5 = iVar5 + 1;
  }
  v = 0;
  iVar5 = 0;
  while ((v < pGia->nObjs && (pGVar4 = Gia_ManObj(pGia,v), pGVar4 != (Gia_Obj_t *)0x0))) {
    uVar1 = *(ulong *)pGVar4;
    if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
      iVar2 = Gia_ObjIsBuf(pGVar4);
      if (iVar2 == 0) {
        uVar3 = pGVar4[-(uVar1 & 0x1fffffff)].Value;
        pGVar4->Value = uVar3;
        if (uVar3 != pGVar4[-(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)].Value) {
          __assert_fail("pObj->Value == Gia_ObjFanin1(pObj)->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                        ,0x123,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
        }
      }
      else {
        uVar3 = Vec_IntEntry(&p->vBuf2LeafNtk,iVar5);
        pGVar4->Value = uVar3;
        iVar5 = iVar5 + 1;
      }
    }
    v = v + 1;
  }
  if (iVar5 == pGia->nBufs) {
    iVar5 = 0;
    while( true ) {
      if (pGia->vCos->nSize - pGia->nRegs <= iVar5) {
        return;
      }
      pGVar4 = Gia_ManCo(pGia,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value != 1) {
        __assert_fail("Gia_ObjFanin0(pObj)->Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,0x129,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
      }
      pGVar4->Value = 1;
      iVar5 = iVar5 + 1;
    }
    return;
  }
  __assert_fail("Count == Gia_ManBufNum(pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                ,0x126,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
}

Assistant:

void Bac_ManMarkNodesGia( Bac_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj; int i, Count = 0;
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == Gia_ManBufNum(pGia) );
    Gia_ManConst0(pGia)->Value = 1;
    Gia_ManForEachPi( pGia, pObj, i )
        pObj->Value = 1;
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Vec_IntEntry( &p->vBuf2LeafNtk, Count++ );
        else
        {
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
            assert( pObj->Value == Gia_ObjFanin1(pObj)->Value );
        }
    }
    assert( Count == Gia_ManBufNum(pGia) );
    Gia_ManForEachPo( pGia, pObj, i )
    {
        assert( Gia_ObjFanin0(pObj)->Value == 1 );
        pObj->Value = 1;
    }
}